

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
* __thiscall
google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::
TryEmplaceInternal<char_const(&)[2]>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
           *__return_storage_ptr__,Map<std::__cxx11::string,std::__cxx11::string> *this,
          char (*k) [2])

{
  bool bVar1;
  map_index_t b;
  NodeBase *node;
  string_view sVar2;
  NodeAndBucket NVar3;
  allocator<char> local_59;
  Arena *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar2 = internal::TransparentSupport<std::__cxx11::string>::ImplicitConvert<char_const(&)[2]>(k);
  NVar3 = internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::FindHelper((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,sVar2);
  node = NVar3.node;
  b = NVar3.bucket;
  if (node == (NodeBase *)0x0) {
    bVar1 = internal::
            KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,(ulong)(*(int *)this + 1));
    if (bVar1) {
      sVar2 = internal::TransparentSupport<std::__cxx11::string>::ImplicitConvert<char_const(&)[2]>
                        (k);
      b = internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::BucketNumber((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this,sVar2);
    }
    node = internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x48);
    local_58 = *(Arena **)(this + 0x18);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*k,&local_59);
    Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(node + 1),
               local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Arena::CreateInArenaStorage<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(node + 5),
               *(Arena **)(this + 0x18));
    internal::
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,b,(KeyNode *)node);
    *(int *)this = *(int *)this + 1;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = node;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ = b;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }